

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::php::EnumOrMessageSuffix_abi_cxx11_
          (string *__return_storage_ptr__,php *this,FieldDescriptor *field,bool is_descriptor)

{
  CppType CVar1;
  Descriptor *desc;
  EnumDescriptor *desc_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  string local_38;
  
  CVar1 = FieldDescriptor::cpp_type((FieldDescriptor *)this);
  if (CVar1 == CPPTYPE_MESSAGE) {
    desc = FieldDescriptor::message_type((FieldDescriptor *)this);
    DescriptorFullName<google::protobuf::Descriptor>(&local_38,desc,SUB81(field,0));
    std::operator+(&bStack_58,", \'",&local_38);
    std::operator+(__return_storage_ptr__,&bStack_58,"\'");
  }
  else {
    CVar1 = FieldDescriptor::cpp_type((FieldDescriptor *)this);
    if (CVar1 != CPPTYPE_ENUM) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&bStack_58);
      return __return_storage_ptr__;
    }
    desc_00 = FieldDescriptor::enum_type((FieldDescriptor *)this);
    DescriptorFullName<google::protobuf::EnumDescriptor>(&local_38,desc_00,SUB81(field,0));
    std::operator+(&bStack_58,", \'",&local_38);
    std::operator+(__return_storage_ptr__,&bStack_58,"\'");
  }
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string EnumOrMessageSuffix(
    const FieldDescriptor* field, bool is_descriptor) {
  if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
    return ", '" + DescriptorFullName(field->message_type(), is_descriptor) + "'";
  }
  if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
    return ", '" + DescriptorFullName(field->enum_type(), is_descriptor) + "'";
  }
  return "";
}